

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

SimpleTimeZone * __thiscall
icu_63::SimpleTimeZone::operator=(SimpleTimeZone *this,SimpleTimeZone *right)

{
  TimeMode TVar1;
  int32_t iVar2;
  
  if (this != right) {
    TimeZone::operator=((TimeZone *)this,(TimeZone *)right);
    this->rawOffset = right->rawOffset;
    this->startMonth = right->startMonth;
    this->startDay = right->startDay;
    this->startDayOfWeek = right->startDayOfWeek;
    TVar1 = right->startTimeMode;
    this->startTime = right->startTime;
    this->startTimeMode = TVar1;
    this->startMode = right->startMode;
    this->endMonth = right->endMonth;
    this->endDay = right->endDay;
    this->endDayOfWeek = right->endDayOfWeek;
    this->endTimeMode = right->endTimeMode;
    iVar2 = right->startYear;
    this->endTime = right->endTime;
    this->startYear = iVar2;
    iVar2 = right->dstSavings;
    this->endMode = right->endMode;
    this->dstSavings = iVar2;
    this->useDaylight = right->useDaylight;
    this->transitionRulesInitialized = '\0';
    this->stdRule = (AnnualTimeZoneRule *)0x0;
    this->dstRule = (AnnualTimeZoneRule *)0x0;
    this->initialRule = (InitialTimeZoneRule *)0x0;
    this->firstTransition = (TimeZoneTransition *)0x0;
  }
  return this;
}

Assistant:

SimpleTimeZone &
SimpleTimeZone::operator=(const SimpleTimeZone &right)
{
    if (this != &right)
    {
        TimeZone::operator=(right);
        rawOffset      = right.rawOffset;
        startMonth     = right.startMonth;
        startDay       = right.startDay;
        startDayOfWeek = right.startDayOfWeek;
        startTime      = right.startTime;
        startTimeMode  = right.startTimeMode;
        startMode      = right.startMode;
        endMonth       = right.endMonth;
        endDay         = right.endDay;
        endDayOfWeek   = right.endDayOfWeek;
        endTime        = right.endTime;
        endTimeMode    = right.endTimeMode;
        endMode        = right.endMode;
        startYear      = right.startYear;
        dstSavings     = right.dstSavings;
        useDaylight    = right.useDaylight;
        clearTransitionRules();
    }
    return *this;
}